

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# czmap.c
# Opt level: O1

void czmap_destroy(czmap *map,czdestroyfunc func)

{
  if (map->left != (czmap *)0x0) {
    czmap_destroy(map->left,func);
  }
  if (map->right != (czmap *)0x0) {
    czmap_destroy(map->right,func);
  }
  if (func != (czdestroyfunc)0x0) {
    (*func)(map->data);
  }
  free(map);
  return;
}

Assistant:

void czmap_destroy(czmap * map, czdestroyfunc func)  {
    if (map->left != NULL)
        czmap_destroy(map->left, func);
    if (map->right != NULL)
        czmap_destroy(map->right, func);
    if (func != NULL)
        func(map->data);
    czmap_internal_free(map);
}